

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

void __thiscall
icu_63::FractionalPartSubstitution::doSubstitution
          (FractionalPartSubstitution *this,double number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  bool bVar1;
  int8_t iVar2;
  int32_t magnitude;
  DecimalQuantity dl;
  
  if (this->byDigits != '\0') {
    icu_63::number::impl::DecimalQuantity::DecimalQuantity(&dl);
    icu_63::number::impl::DecimalQuantity::setToDouble(&dl,number);
    icu_63::number::impl::DecimalQuantity::roundToMagnitude(&dl,-0x14,UNUM_FOUND_HALFEVEN,status);
    magnitude = icu_63::number::impl::DecimalQuantity::getLowerDisplayMagnitude(&dl);
    bVar1 = true;
    for (; magnitude < 0; magnitude = magnitude + 1) {
      if (!(bool)(bVar1 | this->useSpaces == '\0')) {
        icu_63::UnicodeString::insert(toInsertInto,(this->super_NFSubstitution).pos + _pos,L' ');
      }
      iVar2 = icu_63::number::impl::DecimalQuantity::getDigit(&dl,magnitude);
      NFRuleSet::format((this->super_NFSubstitution).ruleSet,(long)iVar2,toInsertInto,
                        (this->super_NFSubstitution).pos + _pos,recursionCount,status);
      bVar1 = false;
    }
    if (bVar1) {
      NFRuleSet::format((this->super_NFSubstitution).ruleSet,0,toInsertInto,
                        _pos + (this->super_NFSubstitution).pos,recursionCount,status);
    }
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&dl);
    return;
  }
  NFSubstitution::doSubstitution
            (&this->super_NFSubstitution,number,toInsertInto,_pos,recursionCount,status);
  return;
}

Assistant:

void
FractionalPartSubstitution::doSubstitution(double number, UnicodeString& toInsertInto,
                                           int32_t _pos, int32_t recursionCount, UErrorCode& status) const
{
  // if we're not in "byDigits" mode, just use the inherited
  // doSubstitution() routine
  if (!byDigits) {
    NFSubstitution::doSubstitution(number, toInsertInto, _pos, recursionCount, status);

    // if we're in "byDigits" mode, transform the value into an integer
    // by moving the decimal point eight places to the right and
    // pulling digits off the right one at a time, formatting each digit
    // as an integer using this substitution's owning rule set
    // (this is slower, but more accurate, than doing it from the
    // other end)
  } else {
    //          int32_t numberToFormat = (int32_t)uprv_round(transformNumber(number) * uprv_pow(10, kMaxDecimalDigits));
    //          // this flag keeps us from formatting trailing zeros.  It starts
    //          // out false because we're pulling from the right, and switches
    //          // to true the first time we encounter a non-zero digit
    //          UBool doZeros = FALSE;
    //          for (int32_t i = 0; i < kMaxDecimalDigits; i++) {
    //              int64_t digit = numberToFormat % 10;
    //              if (digit != 0 || doZeros) {
    //                  if (doZeros && useSpaces) {
    //                      toInsertInto.insert(_pos + getPos(), gSpace);
    //                  }
    //                  doZeros = TRUE;
    //                  getRuleSet()->format(digit, toInsertInto, _pos + getPos());
    //              }
    //              numberToFormat /= 10;
    //          }

    DecimalQuantity dl;
    dl.setToDouble(number);
    dl.roundToMagnitude(-20, UNUM_ROUND_HALFEVEN, status);     // round to 20 fraction digits.
    
    UBool pad = FALSE;
    for (int32_t didx = dl.getLowerDisplayMagnitude(); didx<0; didx++) {
      // Loop iterates over fraction digits, starting with the LSD.
      //   include both real digits from the number, and zeros
      //   to the left of the MSD but to the right of the decimal point.
      if (pad && useSpaces) {
        toInsertInto.insert(_pos + getPos(), gSpace);
      } else {
        pad = TRUE;
      }
      int64_t digit = dl.getDigit(didx);
      getRuleSet()->format(digit, toInsertInto, _pos + getPos(), recursionCount, status);
    }

    if (!pad) {
      // hack around lack of precision in digitlist. if we would end up with
      // "foo point" make sure we add a " zero" to the end.
      getRuleSet()->format((int64_t)0, toInsertInto, _pos + getPos(), recursionCount, status);
    }
  }
}